

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_daload(ExecutionEngine *this)

{
  int iVar1;
  uint32_t uVar2;
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar3;
  anon_union_8_10_52016fac_for_data this_02;
  anon_union_8_10_52016fac_for_data extraout_RDX;
  uint index;
  Value VVar4;
  Value VVar5;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  if (VVar4.type != INT) {
    __assert_fail("index.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x3ea,"void ExecutionEngine::i_daload()");
  }
  VVar5 = Frame::popTopOfOperandStack(this_01);
  this_02 = VVar5.data;
  if ((VVar5._0_8_ & 0xffffffff00000000) != 0x900000000) {
    __assert_fail("arrayref.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x3ec,"void ExecutionEngine::i_daload()");
  }
  iVar1 = (**((Object *)&(this_02.object)->_vptr_Object)->_vptr_Object)(this_02.longValue);
  if (iVar1 != 2) {
    __assert_fail("(arrayref.data.object)->objectType() == ObjectType::ARRAY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x3ed,"void ExecutionEngine::i_daload()");
  }
  uVar2 = ArrayObject::getSize((ArrayObject *)this_02.object);
  index = VVar4.data._0_4_;
  if ((-1 < (int)index) && (index <= uVar2)) {
    VVar4.data.longValue = extraout_RDX.longValue;
    VVar4.printType = BOOLEAN;
    VVar4.type = PADDING;
    Frame::pushIntoOperandStack(this_01,VVar4);
    VVar4 = ArrayObject::getValue((ArrayObject *)this_02.object,index);
    Frame::pushIntoOperandStack(this_01,VVar4);
    this_01->pc = this_01->pc + 1;
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"ArrayIndexOutOfBoundsException");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(2);
}

Assistant:

void ExecutionEngine::i_daload() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
	ArrayObject *array;

    Value index = topFrame->popTopOfOperandStack();
    assert(index.type == ValueType::INT);
    Value arrayref = topFrame->popTopOfOperandStack();
    assert(arrayref.type == ValueType::REFERENCE);
    assert((arrayref.data.object)->objectType() == ObjectType::ARRAY);

    array = (ArrayObject *) arrayref.data.object;

    if (array == NULL) {
        cerr << "NullPointerException" << endl;
        exit(1);
    }
    if (index.data.intValue > array->getSize() || index.data.intValue < 0) {
        cerr << "ArrayIndexOutOfBoundsException" << endl;
        exit(2);
    }

    Value padding;
    padding.type = ValueType::PADDING;
    
    topFrame->pushIntoOperandStack(padding);
    topFrame->pushIntoOperandStack(array->getValue(index.data.intValue));
    topFrame->pc += 1;
}